

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O3

double AndersonDarlingTest(int n,double *random_sample)

{
  double dVar1;
  string local_48;
  double local_28;
  
  local_28 = AndersonDarlingStatistic(n,random_sample);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  StringPrintf_abi_cxx11_(&local_48,"AD stat = %f, n=%d\n",local_28,n);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_28 = AndersonDarlingInf(local_28);
  dVar1 = AndersonDarlingErrFix(n,local_28);
  return dVar1 + local_28;
}

Assistant:

double AndersonDarlingTest(int n, double* random_sample) {
  double ad_statistic = AndersonDarlingStatistic(n, random_sample);
  LOG(INFO) << StringPrintf("AD stat = %f, n=%d\n", ad_statistic, n);
  double p = AndersonDarlingPValue(n, ad_statistic);
  return p;
}